

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QString>::emplace<QLatin1String>
          (QMovableArrayOps<QString> *this,qsizetype i,QLatin1String *args)

{
  QString **ppQVar1;
  QString *pQVar2;
  Data *pDVar3;
  QString *pQVar4;
  storage_type *psVar5;
  char *pcVar6;
  storage_type *psVar7;
  qsizetype *pqVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  Data *local_50;
  char16_t *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if (((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      pQVar4 = pQVar4 + i;
      psVar5 = (storage_type *)args->m_size;
      pcVar6 = args->m_data;
      psVar7 = (storage_type *)0x0;
      if (0 < (long)psVar5) {
        psVar7 = psVar5;
      }
      if (pcVar6 == (char *)0x0) {
        psVar7 = (storage_type *)0x0;
      }
      if (pcVar6 != (char *)0x0 && (long)psVar5 < 0) {
        psVar7 = (storage_type *)strlen(pcVar6);
      }
      QVar11.m_data = psVar7;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromLatin1(QVar11);
      (pQVar4->d).d = local_50;
      (pQVar4->d).ptr = local_48;
      (pQVar4->d).size = local_40;
      goto LAB_004cebcf;
    }
    if ((i == 0) &&
       (pQVar4 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr,
       (QString *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       pQVar4)) {
      psVar5 = (storage_type *)args->m_size;
      pcVar6 = args->m_data;
      psVar7 = (storage_type *)0x0;
      if (0 < (long)psVar5) {
        psVar7 = psVar5;
      }
      if (pcVar6 == (char *)0x0) {
        psVar7 = (storage_type *)0x0;
      }
      if (pcVar6 != (char *)0x0 && (long)psVar5 < 0) {
        psVar7 = (storage_type *)strlen(pcVar6);
      }
      QVar12.m_data = psVar7;
      QVar12.m_size = (qsizetype)&local_50;
      QString::fromLatin1(QVar12);
      pQVar4[-1].d.d = local_50;
      pQVar4[-1].d.ptr = local_48;
      pQVar4[-1].d.size = local_40;
      ppQVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      goto LAB_004cebcf;
    }
  }
  psVar5 = (storage_type *)args->m_size;
  pcVar6 = args->m_data;
  psVar7 = (storage_type *)0x0;
  if (0 < (long)psVar5) {
    psVar7 = psVar5;
  }
  if (pcVar6 == (char *)0x0) {
    psVar7 = (storage_type *)0x0;
  }
  if (pcVar6 != (char *)0x0 && (long)psVar5 < 0) {
    psVar7 = (storage_type *)strlen(pcVar6);
  }
  QVar10.m_data = psVar7;
  QVar10.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar10);
  bVar9 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size != 0;
  QArrayDataPointer<QString>::detachAndGrow
            ((QArrayDataPointer<QString> *)this,(uint)(i == 0 && bVar9),1,(QString **)0x0,
             (QArrayDataPointer<QString> *)0x0);
  pQVar4 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
  if (i == 0 && bVar9) {
    pQVar4[-1].d.d = local_50;
    pQVar4[-1].d.ptr = local_48;
    pQVar4[-1].d.size = local_40;
    (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr = pQVar4 + -1;
  }
  else {
    pQVar2 = pQVar4 + i;
    memmove(pQVar2 + 1,pQVar4 + i,
            ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size - i) *
            0x18);
    (pQVar2->d).d = local_50;
    (pQVar2->d).ptr = local_48;
    (pQVar2->d).size = local_40;
  }
LAB_004cebcf:
  pqVar8 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
  *pqVar8 = *pqVar8 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }